

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,supermap::KeyValue<char,unsigned_int>,supermap::KeyValue<char,unsigned_int>>
          (ResultBuilder *this,KeyValue<char,_unsigned_int> *lhs,KeyValue<char,_unsigned_int> *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  RelationalComparator<0,_supermap::KeyValue<char,_unsigned_int>,_supermap::KeyValue<char,_unsigned_int>_>
  *in_RDI;
  KeyValue<char,_unsigned_int> *in_stack_00000028;
  char *in_stack_00000030;
  KeyValue<char,_unsigned_int> *in_stack_00000038;
  KeyValue<char,_unsigned_int> *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  
  bVar1 = RelationalComparator<0,_supermap::KeyValue<char,_unsigned_int>,_supermap::KeyValue<char,_unsigned_int>_>
          ::operator()(in_RDI,in_stack_ffffffffffffffa8,(KeyValue<char,_unsigned_int> *)0x16da71);
  in_RDI[0x28] = (RelationalComparator<0,_supermap::KeyValue<char,_unsigned_int>,_supermap::KeyValue<char,_unsigned_int>_>
                  )((bVar1 ^ 0xffU) & 1);
  if ((((byte)in_RDI[0x28] & 1) == 0) && (pCVar2 = getContextOptions(), (pCVar2->success & 1U) == 0)
     ) {
    return;
  }
  stringifyBinaryExpr<supermap::KeyValue<char,unsigned_int>,supermap::KeyValue<char,unsigned_int>>
            (in_stack_00000038,in_stack_00000030,in_stack_00000028);
  String::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  String::~String(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }